

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linux.c
# Opt level: O1

int uv_cpu_info(uv_cpu_info_t **ci,int *count)

{
  undefined1 auVar1 [12];
  int iVar2;
  void *ptr;
  int *piVar3;
  char *pcVar4;
  size_t sVar5;
  void *pvVar6;
  ulong uVar7;
  bool bVar8;
  void *local_ae0;
  undefined4 local_ad8;
  long local_ad0;
  long local_ac8;
  long local_ac0;
  long local_ab8;
  long local_ab0;
  char local_aa8 [8];
  char buf [1024];
  char models [8] [64];
  uchar bitmap [1024];
  char *local_a0;
  char (*model) [64];
  cpu t;
  cpu *c;
  cpu (*cpus) [8192];
  unsigned_long_long skip;
  uint size;
  uint maxcpu;
  uint cpu;
  uint i;
  int n;
  int found;
  char *p;
  FILE *fp;
  int *count_local;
  uv_cpu_info_t **ci_local;
  
  fp = (FILE *)count;
  count_local = (int *)ci;
  memset(models[7] + 0x38,0,0x400);
  memset(buf + 0x3f8,0,0x200);
  snprintf(buf + 0x3f8,0x40,"unknown");
  skip._4_4_ = 0;
  ptr = uv__calloc(0x2000,0x38);
  if (ptr == (void *)0x0) {
    ci_local._4_4_ = -0xc;
  }
  else {
    p = (char *)uv__open_file("/proc/stat");
    if ((FILE *)p == (FILE *)0x0) {
      uv__free(ptr);
      piVar3 = __errno_location();
      ci_local._4_4_ = -*piVar3;
    }
    else {
      pcVar4 = fgets(local_aa8,0x400,(FILE *)p);
      if (pcVar4 == (char *)0x0) {
        abort();
      }
      while( true ) {
        memset(&model,0,0x38);
        cpu = fscanf((FILE *)p,"cpu%u %llu %llu %llu %llu %llu %llu",&size,&t,&t.user,&t.nice,&t.sys
                     ,&cpus,&t.idle);
        if (cpu != 7) break;
        pcVar4 = fgets(local_aa8,0x400,(FILE *)p);
        if (pcVar4 == (char *)0x0) {
          abort();
        }
        if (size < 0x2000) {
          memcpy((void *)((long)ptr + (ulong)size * 0x38),&model,0x38);
          models[7][(ulong)(size >> 3) + 0x38] =
               models[7][(ulong)(size >> 3) + 0x38] | (byte)(1 << ((byte)size & 7));
          if (skip._4_4_ <= size) {
            skip._4_4_ = size + 1;
          }
        }
      }
      fclose((FILE *)p);
      p = (char *)uv__open_file("/proc/cpuinfo");
      if ((FILE *)p != (FILE *)0x0) {
LAB_00129c70:
        iVar2 = fscanf((FILE *)p,"processor\t: %u\n",&size);
        if (iVar2 == 1) {
          i = 0;
          while( true ) {
            bVar8 = false;
            if (i == 0) {
              pcVar4 = fgets(local_aa8,0x400,(FILE *)p);
              bVar8 = pcVar4 != (char *)0x0;
            }
            if (!bVar8) break;
            iVar2 = strncmp(local_aa8,"model name\t: ",0xd);
            i = (uint)((iVar2 != 0 ^ 0xffU) & 1);
          }
          if (i != 0) {
            _n = buf + 5;
            sVar5 = strcspn(_n,"\n");
            cpu = (uint)sVar5;
            local_a0 = buf + 0x3f8;
            i = 0;
            while (pcVar4 = _n, i == 0 && local_a0 < models[7] + 0x38) {
              sVar5 = strlen(local_a0);
              iVar2 = strncmp(pcVar4,local_a0,sVar5);
              local_a0 = local_a0 + 0x40;
              i = (uint)((iVar2 != 0 ^ 0xffU) & 1);
            }
            if (i != 0) {
              if (*local_a0 == '\0') {
                snprintf(local_a0,0x40,"%.*s",(ulong)cpu,_n);
              }
              if (size < skip._4_4_) {
                *(int *)((long)ptr + (ulong)size * 0x38 + 0x30) =
                     (int)((long)local_a0 - (long)(buf + 0x3f8) >> 6);
              }
            }
          }
          do {
            pcVar4 = fgets(local_aa8,0x400,(FILE *)p);
            if (pcVar4 == (char *)0x0) break;
          } while (local_aa8[0] != '\n');
          goto LAB_00129c70;
        }
        fclose((FILE *)p);
        p = (char *)0x0;
      }
      cpu = 0;
      for (size = 0; size < skip._4_4_; size = size + 1) {
        if (((uint)(byte)models[7][(ulong)(size >> 3) + 0x38] & 1 << ((byte)size & 7)) != 0) {
          cpu = cpu + 1;
          snprintf(local_aa8,0x400,"/sys/devices/system/cpu/cpu%u/cpufreq/scaling_cur_freq",
                   (ulong)size);
          p = (char *)uv__open_file(local_aa8);
          if ((FILE *)p != (FILE *)0x0) {
            iVar2 = fscanf((FILE *)p,"%llu",(void *)((long)ptr + (ulong)size * 0x38));
            if (iVar2 != 1) {
              abort();
            }
            fclose((FILE *)p);
            p = (char *)0x0;
          }
        }
      }
      skip._0_4_ = cpu * 0x38 + 0x200;
      pvVar6 = uv__malloc((ulong)(uint)skip);
      *(void **)count_local = pvVar6;
      fp->_flags = 0;
      if (*(long *)count_local == 0) {
        uv__free(ptr);
        ci_local._4_4_ = -0xc;
      }
      else {
        fp->_flags = cpu;
        pvVar6 = (void *)(*(long *)count_local + (long)(int)cpu * 0x38);
        memcpy(pvVar6,buf + 0x3f8,0x200);
        _n = (char *)pvVar6;
        maxcpu = 0;
        for (size = 0; size < skip._4_4_; size = size + 1) {
          if (((uint)(byte)models[7][(ulong)(size >> 3) + 0x38] & 1 << ((byte)size & 7)) != 0) {
            t._48_8_ = (long)ptr + (ulong)size * 0x38;
            uVar7 = (ulong)maxcpu;
            local_ae0 = (void *)((long)_n + (ulong)(uint)*(ulong *)(t._48_8_ + 0x30) * 0x40);
            auVar1._8_4_ = 0;
            auVar1._0_8_ = *(ulong *)t._48_8_;
            local_ad8 = SUB124(auVar1 / ZEXT812(1000),0);
            local_ad0 = *(ulong *)(t._48_8_ + 8) * 10;
            local_ac8 = *(ulong *)(t._48_8_ + 0x10) * 10;
            local_ac0 = *(ulong *)(t._48_8_ + 0x18) * 10;
            local_ab8 = *(ulong *)(t._48_8_ + 0x20) * 10;
            local_ab0 = *(ulong *)(t._48_8_ + 0x28) * 10;
            maxcpu = maxcpu + 1;
            memcpy((void *)(*(long *)count_local + uVar7 * 0x38),&local_ae0,0x38);
          }
        }
        uv__free(ptr);
        ci_local._4_4_ = 0;
      }
    }
  }
  return ci_local._4_4_;
}

Assistant:

int uv_cpu_info(uv_cpu_info_t** ci, int* count) {
#if defined(__PPC__)
  static const char model_marker[] = "cpu\t\t: ";
#elif defined(__arm__)
  static const char model_marker[] = "Processor\t: ";
#elif defined(__aarch64__)
  static const char model_marker[] = "CPU part\t: ";
#elif defined(__mips__)
  static const char model_marker[] = "cpu model\t\t: ";
#elif defined(__loongarch__)
  static const char model_marker[] = "cpu family\t\t: ";
#else
  static const char model_marker[] = "model name\t: ";
#endif
  static const char parts[] =
#ifdef __aarch64__
    "0x811\nARM810\n"       "0x920\nARM920\n"      "0x922\nARM922\n"
    "0x926\nARM926\n"       "0x940\nARM940\n"      "0x946\nARM946\n"
    "0x966\nARM966\n"       "0xa20\nARM1020\n"      "0xa22\nARM1022\n"
    "0xa26\nARM1026\n"      "0xb02\nARM11 MPCore\n" "0xb36\nARM1136\n"
    "0xb56\nARM1156\n"      "0xb76\nARM1176\n"      "0xc05\nCortex-A5\n"
    "0xc07\nCortex-A7\n"    "0xc08\nCortex-A8\n"    "0xc09\nCortex-A9\n"
    "0xc0d\nCortex-A17\n"   /* Originally A12 */
    "0xc0f\nCortex-A15\n"   "0xc0e\nCortex-A17\n"   "0xc14\nCortex-R4\n"
    "0xc15\nCortex-R5\n"    "0xc17\nCortex-R7\n"    "0xc18\nCortex-R8\n"
    "0xc20\nCortex-M0\n"    "0xc21\nCortex-M1\n"    "0xc23\nCortex-M3\n"
    "0xc24\nCortex-M4\n"    "0xc27\nCortex-M7\n"    "0xc60\nCortex-M0+\n"
    "0xd01\nCortex-A32\n"   "0xd03\nCortex-A53\n"   "0xd04\nCortex-A35\n"
    "0xd05\nCortex-A55\n"   "0xd06\nCortex-A65\n"   "0xd07\nCortex-A57\n"
    "0xd08\nCortex-A72\n"   "0xd09\nCortex-A73\n"   "0xd0a\nCortex-A75\n"
    "0xd0b\nCortex-A76\n"   "0xd0c\nNeoverse-N1\n"  "0xd0d\nCortex-A77\n"
    "0xd0e\nCortex-A76AE\n" "0xd13\nCortex-R52\n"   "0xd20\nCortex-M23\n"
    "0xd21\nCortex-M33\n"   "0xd41\nCortex-A78\n"   "0xd42\nCortex-A78AE\n"
    "0xd4a\nNeoverse-E1\n"  "0xd4b\nCortex-A78C\n"
#endif
    "";
  struct cpu {
    unsigned long long freq, user, nice, sys, idle, irq;
    unsigned model;
  };
  FILE* fp;
  char* p;
  int found;
  int n;
  unsigned i;
  unsigned cpu;
  unsigned maxcpu;
  unsigned size;
  unsigned long long skip;
  struct cpu (*cpus)[8192];  /* Kernel maximum. */
  struct cpu* c;
  struct cpu t;
  char (*model)[64];
  unsigned char bitmap[ARRAY_SIZE(*cpus) / 8];
  /* Assumption: even big.LITTLE systems will have only a handful
   * of different CPU models. Most systems will just have one.
   */
  char models[8][64];
  char buf[1024];

  memset(bitmap, 0, sizeof(bitmap));
  memset(models, 0, sizeof(models));
  snprintf(*models, sizeof(*models), "unknown");
  maxcpu = 0;

  cpus = uv__calloc(ARRAY_SIZE(*cpus), sizeof(**cpus));
  if (cpus == NULL)
    return UV_ENOMEM;

  fp = uv__open_file("/proc/stat");
  if (fp == NULL) {
    uv__free(cpus);
    return UV__ERR(errno);
  }

  if (NULL == fgets(buf, sizeof(buf), fp))
    abort();

  for (;;) {
    memset(&t, 0, sizeof(t));

    n = fscanf(fp, "cpu%u %llu %llu %llu %llu %llu %llu",
               &cpu, &t.user, &t.nice, &t.sys, &t.idle, &skip, &t.irq);

    if (n != 7)
      break;

    if (NULL == fgets(buf, sizeof(buf), fp))
      abort();

    if (cpu >= ARRAY_SIZE(*cpus))
      continue;

    (*cpus)[cpu] = t;

    bitmap[cpu >> 3] |= 1 << (cpu & 7);

    if (cpu >= maxcpu)
      maxcpu = cpu + 1;
  }

  fclose(fp);

  fp = uv__open_file("/proc/cpuinfo");
  if (fp == NULL)
    goto nocpuinfo;

  for (;;) {
    if (1 != fscanf(fp, "processor\t: %u\n", &cpu))
      break;  /* Parse error. */

    found = 0;
    while (!found && fgets(buf, sizeof(buf), fp))
      found = !strncmp(buf, model_marker, sizeof(model_marker) - 1);

    if (!found)
      goto next;

    p = buf + sizeof(model_marker) - 1;
    n = (int) strcspn(p, "\n");

    /* arm64: translate CPU part code to model name. */
    if (*parts) {
      p = memmem(parts, sizeof(parts) - 1, p, n + 1);
      if (p == NULL)
        p = "unknown";
      else
        p += n + 1;
      n = (int) strcspn(p, "\n");
    }

    found = 0;
    for (model = models; !found && model < ARRAY_END(models); model++)
      found = !strncmp(p, *model, strlen(*model));

    if (!found)
      goto next;

    if (**model == '\0')
      snprintf(*model, sizeof(*model), "%.*s", n, p);

    if (cpu < maxcpu)
      (*cpus)[cpu].model = model - models;

next:
    while (fgets(buf, sizeof(buf), fp))
      if (*buf == '\n')
        break;
  }

  fclose(fp);
  fp = NULL;

nocpuinfo:

  n = 0;
  for (cpu = 0; cpu < maxcpu; cpu++) {
    if (!(bitmap[cpu >> 3] & (1 << (cpu & 7))))
      continue;

    n++;
    snprintf(buf, sizeof(buf),
             "/sys/devices/system/cpu/cpu%u/cpufreq/scaling_cur_freq", cpu);

    fp = uv__open_file(buf);
    if (fp == NULL)
      continue;

    if (1 != fscanf(fp, "%llu", &(*cpus)[cpu].freq))
      abort();
    fclose(fp);
    fp = NULL;
  }

  size = n * sizeof(**ci) + sizeof(models);
  *ci = uv__malloc(size);
  *count = 0;

  if (*ci == NULL) {
    uv__free(cpus);
    return UV_ENOMEM;
  }

  *count = n;
  p = memcpy(*ci + n, models, sizeof(models));

  i = 0;
  for (cpu = 0; cpu < maxcpu; cpu++) {
    if (!(bitmap[cpu >> 3] & (1 << (cpu & 7))))
      continue;

    c = *cpus + cpu;

    (*ci)[i++] = (uv_cpu_info_t) {
      .model     = p + c->model * sizeof(*model),
      .speed     = c->freq / 1000,
      /* Note: sysconf(_SC_CLK_TCK) is fixed at 100 Hz,
       * therefore the multiplier is always 1000/100 = 10.
       */
      .cpu_times = (struct uv_cpu_times_s) {
        .user = 10 * c->user,
        .nice = 10 * c->nice,
        .sys  = 10 * c->sys,
        .idle = 10 * c->idle,
        .irq  = 10 * c->irq,
      },
    };
  }

  uv__free(cpus);

  return 0;
}